

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O2

void __thiscall bandit::detail::spec_reporter::it_skip(spec_reporter *this,char *desc)

{
  int *piVar1;
  ostream *poVar2;
  string local_40;
  
  piVar1 = &(this->super_progress_reporter).specs_skipped_;
  *piVar1 = *piVar1 + 1;
  poVar2 = this->stm_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,"- it ");
  poVar2 = std::operator<<(poVar2,desc);
  poVar2 = std::operator<<(poVar2," ... SKIPPED");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_40);
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_skip(const char* desc)
    {
      progress_reporter::it_skip(desc);
      stm_ << indent() << "- it " << desc << " ... SKIPPED" << std::endl;
      stm_.flush();
    }